

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O2

void rpn_Symbol(Expression *expr,char *symName)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  Symbol *pSVar4;
  Section *pSVar5;
  char *pcVar6;
  size_t sVar7;
  uint8_t *puVar8;
  int *piVar9;
  char *__format;
  char *__format_00;
  
  pSVar4 = sym_FindScopedSymbol(symName);
  bVar1 = sym_IsPC(pSVar4);
  if ((bVar1) && (pSVar5 = sect_GetSymbolSection(), pSVar5 == (Section *)0x0)) {
    error("PC has no value outside a section\n");
    expr->reason = (char *)0x0;
    expr->isKnown = true;
    expr->isSymbol = false;
    expr->rpnPatchSize = 0;
    expr->rpn = (uint8_t *)0x0;
    expr->rpnCapacity = 0;
    expr->rpnLength = 0;
    expr->val = 0;
    return;
  }
  if ((pSVar4 != (Symbol *)0x0) &&
     ((pSVar4->type - SYM_EQU < 2 ||
      (((pSVar4->type == SYM_LABEL && (pSVar5 = sym_GetSection(pSVar4), pSVar5 != (Section *)0x0))
       && (pSVar5->org != 0xffffffff)))))) {
    uVar2 = sym_GetConstantValue(symName);
    expr->reason = (char *)0x0;
    expr->isKnown = true;
    expr->isSymbol = false;
    expr->rpn = (uint8_t *)0x0;
    expr->rpnCapacity = 0;
    expr->rpnLength = 0;
    expr->rpnPatchSize = 0;
    expr->val = uVar2;
    return;
  }
  expr->rpn = (uint8_t *)0x0;
  expr->rpnCapacity = 0;
  expr->rpnLength = 0;
  expr->rpnPatchSize = 0;
  expr->isKnown = false;
  expr->isSymbol = true;
  pcVar6 = (char *)malloc(0x80);
  expr->reason = pcVar6;
  if (pcVar6 == (char *)0x0) {
LAB_00110458:
    piVar9 = __errno_location();
    pcVar6 = strerror(*piVar9);
    fatalerror("Can\'t allocate err string: %s\n",pcVar6);
  }
  bVar1 = sym_IsPC(pSVar4);
  __format_00 = "\'%s\' is not constant at assembly time";
  __format = "\'%s\' is not constant at assembly time";
  if (bVar1) {
    __format = "PC is not constant at assembly time";
  }
  iVar3 = snprintf(pcVar6,0x80,__format,symName);
  if (0x7f < iVar3) {
    pcVar6 = (char *)realloc(expr->reason,(ulong)(iVar3 + 1));
    expr->reason = pcVar6;
    if (pcVar6 == (char *)0x0) goto LAB_00110458;
    bVar1 = sym_IsPC(pSVar4);
    if (bVar1) {
      __format_00 = "PC is not constant at assembly time";
    }
    sprintf(pcVar6,__format_00,symName);
  }
  pSVar4 = sym_Ref(symName);
  expr->rpnPatchSize = expr->rpnPatchSize + 5;
  sVar7 = strlen(pSVar4->name);
  puVar8 = reserveSpace(expr,(int)sVar7 + 2);
  *puVar8 = 0x81;
  memcpy(puVar8 + 1,pSVar4,sVar7 + 1);
  return;
}

Assistant:

void rpn_Symbol(struct Expression *expr, char const *symName)
{
	struct Symbol *sym = sym_FindScopedSymbol(symName);

	if (sym_IsPC(sym) && !sect_GetSymbolSection()) {
		error("PC has no value outside a section\n");
		rpn_Number(expr, 0);
	} else if (!sym || !sym_IsConstant(sym)) {
		rpn_Init(expr);
		expr->isSymbol = true;

		makeUnknown(expr, sym_IsPC(sym) ? "PC is not constant at assembly time"
						: "'%s' is not constant at assembly time", symName);
		sym = sym_Ref(symName);
		expr->rpnPatchSize += 5; // 1-byte opcode + 4-byte symbol ID

		size_t nameLen = strlen(sym->name) + 1; // Don't forget NUL!
		uint8_t *ptr = reserveSpace(expr, nameLen + 1);
		*ptr++ = RPN_SYM;
		memcpy(ptr, sym->name, nameLen);
	} else {
		rpn_Number(expr, sym_GetConstantValue(symName));
	}
}